

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void config_add_comment(ALLEGRO_CONFIG *config,ALLEGRO_USTR *section,ALLEGRO_USTR *comment)

{
  ALLEGRO_CONFIG_SECTION *file;
  ALLEGRO_CONFIG_ENTRY *pAVar1;
  ALLEGRO_USTR *pAVar2;
  ALLEGRO_CONFIG *in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  ALLEGRO_CONFIG_ENTRY *entry;
  ALLEGRO_CONFIG_SECTION *s;
  ALLEGRO_USTR *in_stack_ffffffffffffffd8;
  ALLEGRO_CONFIG *in_stack_ffffffffffffffe0;
  
  file = find_section(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pAVar1 = (ALLEGRO_CONFIG_ENTRY *)
           al_calloc_with_context
                     (in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),(char *)file,
                      (char *)in_stack_ffffffffffffffd8);
  pAVar1->is_comment = true;
  pAVar2 = al_ustr_dup((ALLEGRO_USTR *)0x14b6ee);
  pAVar1->key = pAVar2;
  al_ustr_find_replace_cstr((ALLEGRO_USTR *)config,section._4_4_,(char *)comment,(char *)s);
  if (file == (ALLEGRO_CONFIG_SECTION *)0x0) {
    file = config_add_section(in_RDX,(ALLEGRO_USTR *)0x0);
  }
  if (file->head == (ALLEGRO_CONFIG_ENTRY *)0x0) {
    file->head = pAVar1;
    file->last = pAVar1;
  }
  else {
    file->last->next = pAVar1;
    pAVar1->prev = file->last;
    file->last = pAVar1;
  }
  return;
}

Assistant:

static void config_add_comment(ALLEGRO_CONFIG *config,
   const ALLEGRO_USTR *section, const ALLEGRO_USTR *comment)
{
   ALLEGRO_CONFIG_SECTION *s;
   ALLEGRO_CONFIG_ENTRY *entry;

   s = find_section(config, section);

   entry = al_calloc(1, sizeof(ALLEGRO_CONFIG_ENTRY));
   entry->is_comment = true;
   entry->key = al_ustr_dup(comment);

   /* Replace all newline characters by spaces, otherwise the written comment
    * file will be corrupted.
    */
   al_ustr_find_replace_cstr(entry->key, 0, "\n", " ");

   if (!s) {
      s = config_add_section(config, section);
   }

   if (s->head == NULL) {
      s->head = entry;
      s->last = entry;
   }
   else {
      ASSERT(s->last->next == NULL);
      s->last->next = entry;
      entry->prev = s->last;
      s->last = entry;
   }
}